

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O3

llama_token __thiscall mtmd_context::lookup_token(mtmd_context *this,string *token_text)

{
  _Alloc_hider _Var1;
  int iVar2;
  int iVar3;
  llama_vocab *vocab;
  int token;
  bool bVar4;
  string local_50;
  
  vocab = (llama_vocab *)llama_model_get_vocab(this->text_model);
  iVar2 = llama_vocab_n_tokens(vocab);
  if (0 < iVar2) {
    token = 0;
    do {
      token_to_piece_abi_cxx11_(&local_50,this,vocab,token,true);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == token_text->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar4 = true;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,(token_text->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar4 = iVar3 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        return token;
      }
      token = token + 1;
    } while (iVar2 != token);
  }
  return -1;
}

Assistant:

llama_token lookup_token(const std::string & token_text) {
        const llama_vocab * vocab = llama_model_get_vocab(text_model);
        const int n_vocab = llama_vocab_n_tokens(vocab);
        for (int i = 0; i < n_vocab; i++) {
            if (token_to_piece(vocab, i, true) == token_text) {
                return i;
            }
        }
        return LLAMA_TOKEN_NULL;
    }